

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::toHueRainbow(Image *__return_storage_ptr__,Image *_in)

{
  int iVar1;
  int iVar2;
  uint _width;
  uint _height;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  int x;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float _hue;
  vec3 local_40;
  
  iVar2 = (*_in->_vptr_Image[8])(_in);
  if (iVar2 < 2) {
    _width = (*_in->_vptr_Image[6])(_in);
    _height = (*_in->_vptr_Image[7])(_in);
    Image::Image(__return_storage_ptr__,_width,_height,3);
    uVar7 = 0;
    uVar8 = (ulong)_width;
    if ((int)_width < 1) {
      uVar8 = uVar7;
    }
    uVar6 = (ulong)_height;
    if ((int)_height < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        iVar2 = __return_storage_ptr__->m_width;
        iVar1 = __return_storage_ptr__->m_channels;
        iVar3 = (*_in->_vptr_Image[0xe])(_in,uVar5,uVar7);
        (*_in->_vptr_Image[0x18])(_in,CONCAT44(extraout_var,iVar3));
        local_40 = hue2rgb(_hue);
        (*__return_storage_ptr__->_vptr_Image[0x12])
                  (__return_storage_ptr__,((long)iVar2 * uVar7 + uVar5) * (long)iVar1,&local_40,3);
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"The input image have more than one channel");
    std::endl<char,std::char_traits<char>>(poVar4);
    Image::Image(__return_storage_ptr__,_in);
  }
  return __return_storage_ptr__;
}

Assistant:

Image toHueRainbow(const Image& _in) {
    if (_in.getChannels() > 1) {
        std::cout << "The input image have more than one channel" << std::endl;
        return _in;
    }

    int width = _in.getWidth();
    int height = _in.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++)
        for(int x = 0; x < width; x++)
            out.setColor( out.getIndex(x,y), hue2rgb( _in.getValue(_in.getIndex(x,y)) ) );

    return out;
}